

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::draw_text
          (Image *this,ssize_t x,ssize_t y,ssize_t *width,ssize_t *height,uint32_t color,
          uint32_t background,char *fmt,...)

{
  char in_AL;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  va[0].reg_save_area = local_e8;
  va[0].overflow_arg_area = &stack0x00000018;
  va[0].gp_offset = 0x30;
  va[0].fp_offset = 0x30;
  draw_text_v(this,x,y,width,height,(ulong)(color >> 0x18),(ulong)(color >> 0x10 & 0xff),
              (ulong)(color >> 8 & 0xff),(ulong)(color & 0xff),(ulong)(background >> 0x18),
              (ulong)(background >> 0x10 & 0xff),(ulong)(background >> 8 & 0xff),
              (ulong)(background & 0xff),fmt,va);
  return;
}

Assistant:

void Image::draw_text(ssize_t x, ssize_t y, ssize_t* width, ssize_t* height,
    uint32_t color, uint32_t background, const char* fmt, ...) {
  va_list va;
  va_start(va, fmt);
  try {
    this->draw_text_v(x, y, width, height,
        (color >> 24) & 0xFF, (color >> 16) & 0xFF, (color >> 8) & 0xFF, color & 0xFF,
        (background >> 24) & 0xFF, (background >> 16) & 0xFF, (background >> 8) & 0xFF, background & 0xFF,
        fmt, va);
  } catch (...) {
    va_end(va);
    throw;
  }
  va_end(va);
}